

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImageList.cpp
# Opt level: O3

void __thiscall
irr::gui::CGUIImageList::draw(CGUIImageList *this,s32 index,vector2d<int> *destPos,rect<int> *clip)

{
  long *plVar1;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  if (((-1 < index) &&
      (plVar1 = *(long **)&(this->super_IGUIImageList).field_0x8, plVar1 != (long *)0x0)) &&
     (index < *(int *)&(this->super_IGUIImageList).field_0x18)) {
    local_8 = *(int *)&(this->super_IGUIImageList).field_0x1c;
    local_10 = (index % this->ImagesPerRow) * local_8;
    local_c = (index / this->ImagesPerRow) * *(int *)&this->field_0x20;
    local_8 = local_10 + local_8;
    local_4 = local_c + *(int *)&this->field_0x20;
    (**(code **)(*plVar1 + 0x180))
              (plVar1,*(undefined8 *)&(this->super_IGUIImageList).field_0x10,destPos,&local_10,clip,
               0xffffffff,this->UseAlphaChannel);
  }
  return;
}

Assistant:

void CGUIImageList::draw(s32 index, const core::position2d<s32> &destPos,
		const core::rect<s32> *clip /*= 0*/)
{
	core::rect<s32> sourceRect;

	if (!Driver || index < 0 || index >= ImageCount) {
		return;
	}

	sourceRect.UpperLeftCorner.X = (index % ImagesPerRow) * ImageSize.Width;
	sourceRect.UpperLeftCorner.Y = (index / ImagesPerRow) * ImageSize.Height;
	sourceRect.LowerRightCorner.X = sourceRect.UpperLeftCorner.X + ImageSize.Width;
	sourceRect.LowerRightCorner.Y = sourceRect.UpperLeftCorner.Y + ImageSize.Height;

	Driver->draw2DImage(Texture, destPos, sourceRect, clip,
			video::SColor(255, 255, 255, 255), UseAlphaChannel);
}